

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O1

bool ON_DimStyle::Internal_EqualOverrideParentFields(ON_DimStyle *a,ON_DimStyle *b)

{
  ON__UINT32 OVar1;
  ON__UINT32 OVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  auVar3[0] = -((char)b->m_field_override_parent_count == (char)a->m_field_override_parent_count);
  auVar3[1] = -(*(char *)((long)&b->m_field_override_parent_count + 1) ==
               *(char *)((long)&a->m_field_override_parent_count + 1));
  auVar3[2] = -(*(char *)((long)&b->m_field_override_parent_count + 2) ==
               *(char *)((long)&a->m_field_override_parent_count + 2));
  auVar3[3] = -(*(char *)((long)&b->m_field_override_parent_count + 3) ==
               *(char *)((long)&a->m_field_override_parent_count + 3));
  auVar3[4] = -((char)b->m_field_override_parent_bits0 == (char)a->m_field_override_parent_bits0);
  auVar3[5] = -(*(char *)((long)&b->m_field_override_parent_bits0 + 1) ==
               *(char *)((long)&a->m_field_override_parent_bits0 + 1));
  auVar3[6] = -(*(char *)((long)&b->m_field_override_parent_bits0 + 2) ==
               *(char *)((long)&a->m_field_override_parent_bits0 + 2));
  auVar3[7] = -(*(char *)((long)&b->m_field_override_parent_bits0 + 3) ==
               *(char *)((long)&a->m_field_override_parent_bits0 + 3));
  auVar3[8] = -((char)b->m_field_override_parent_bits1 == (char)a->m_field_override_parent_bits1);
  auVar3[9] = -(*(char *)((long)&b->m_field_override_parent_bits1 + 1) ==
               *(char *)((long)&a->m_field_override_parent_bits1 + 1));
  auVar3[10] = -(*(char *)((long)&b->m_field_override_parent_bits1 + 2) ==
                *(char *)((long)&a->m_field_override_parent_bits1 + 2));
  auVar3[0xb] = -(*(char *)((long)&b->m_field_override_parent_bits1 + 3) ==
                 *(char *)((long)&a->m_field_override_parent_bits1 + 3));
  auVar3[0xc] = -((char)b->m_field_override_parent_bits2 == (char)a->m_field_override_parent_bits2);
  auVar3[0xd] = -(*(char *)((long)&b->m_field_override_parent_bits2 + 1) ==
                 *(char *)((long)&a->m_field_override_parent_bits2 + 1));
  auVar3[0xe] = -(*(char *)((long)&b->m_field_override_parent_bits2 + 2) ==
                 *(char *)((long)&a->m_field_override_parent_bits2 + 2));
  auVar3[0xf] = -(*(char *)((long)&b->m_field_override_parent_bits2 + 3) ==
                 *(char *)((long)&a->m_field_override_parent_bits2 + 3));
  OVar1 = a->m_field_override_parent_bits3;
  OVar2 = b->m_field_override_parent_bits3;
  auVar4[0] = -((char)OVar2 == (char)OVar1);
  auVar4[1] = -((char)(OVar2 >> 8) == (char)(OVar1 >> 8));
  auVar4[2] = -((char)(OVar2 >> 0x10) == (char)(OVar1 >> 0x10));
  auVar4[3] = -((char)(OVar2 >> 0x18) == (char)(OVar1 >> 0x18));
  auVar4[4] = 0xff;
  auVar4[5] = 0xff;
  auVar4[6] = 0xff;
  auVar4[7] = 0xff;
  auVar4[8] = 0xff;
  auVar4[9] = 0xff;
  auVar4[10] = 0xff;
  auVar4[0xb] = 0xff;
  auVar4[0xc] = 0xff;
  auVar4[0xd] = 0xff;
  auVar4[0xe] = 0xff;
  auVar4[0xf] = 0xff;
  auVar4 = auVar4 & auVar3;
  return (ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                  (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe |
                 (ushort)(byte)(auVar4[0xf] >> 7) << 0xf) == 0xffff;
}

Assistant:

bool ON_DimStyle::Internal_EqualOverrideParentFields(
    const ON_DimStyle& a,
    const ON_DimStyle& b
  )
{
  return (
    a.m_field_override_parent_count == b.m_field_override_parent_count
    && a.m_field_override_parent_bits0 == b.m_field_override_parent_bits0
    && a.m_field_override_parent_bits1 == b.m_field_override_parent_bits1
    && a.m_field_override_parent_bits2 == b.m_field_override_parent_bits2
    && a.m_field_override_parent_bits3 == b.m_field_override_parent_bits3
    );
}